

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcp_dialer_close(void *arg)

{
  nni_list *list;
  nni_aio *aio;
  tcp_dialer *d;
  
  if (arg != (void *)0x0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x588));
    *(undefined1 *)((long)arg + 0x148) = 1;
    list = (nni_list *)((long)arg + 0x570);
    aio = (nni_aio *)nni_list_first(list);
    while (aio != (nni_aio *)0x0) {
      nni_list_remove(list,aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first(list);
    }
    nni_tcp_dialer_close(*(nni_tcp_dialer **)((long)arg + 0x1d8));
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x588));
    return;
  }
  return;
}

Assistant:

static void
tcp_dialer_close(void *arg)
{
	tcp_dialer *d = arg;
	nni_aio    *aio;

	if (d != NULL) {
		nni_mtx_lock(&d->mtx);
		d->closed = true;
		while ((aio = nni_list_first(&d->conaios)) != NULL) {
			nni_list_remove(&d->conaios, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		nni_tcp_dialer_close(d->d);
		nni_mtx_unlock(&d->mtx);
	}
}